

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_node_struct *n,xpath_allocator *alloc)

{
  bool bVar1;
  uint uVar2;
  xml_node xStack_38;
  xpath_node local_30;
  
  if (n == (xml_node_struct *)0x0) {
    __assert_fail("n",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0x2637,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_node_struct *, xpath_allocator *)"
                 );
  }
  if (7 < (byte)this->_test - 1) {
    __assert_fail("false && \"Unknown axis\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0x267a,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_node_struct *, xpath_allocator *)"
                 );
  }
  uVar2 = (uint)n->header & 0xf;
  switch((uint)(byte)this->_test) {
  case 1:
    if (uVar2 != 2) {
      return false;
    }
    goto LAB_001289d9;
  case 3:
    if (uVar2 != 5) {
      return false;
    }
    break;
  case 4:
    if (uVar2 != 6) {
      return false;
    }
    break;
  case 5:
    if (1 < uVar2 - 3) {
      return false;
    }
    break;
  case 6:
    if (uVar2 != 6) {
      return false;
    }
LAB_001289d9:
    if (n->name != (char_t *)0x0) {
      bVar1 = strequal(n->name,(this->_data).string);
LAB_001289ee:
      if (bVar1 != false) break;
    }
    return false;
  case 7:
    if (uVar2 != 2) {
      return false;
    }
    break;
  case 8:
    if (uVar2 != 2) {
      return false;
    }
    if (n->name == (char_t *)0x0) {
      return false;
    }
    bVar1 = starts_with(n->name,(this->_data).string);
    goto LAB_001289ee;
  }
  xml_node::xml_node(&xStack_38,n);
  xpath_node::xpath_node(&local_30,&xStack_38);
  xpath_node_set_raw::push_back(ns,&local_30,alloc);
  return true;
}

Assistant:

bool step_push(xpath_node_set_raw& ns, xml_node_struct* n, xpath_allocator* alloc)
		{
			assert(n);

			xml_node_type type = PUGI__NODETYPE(n);

			switch (_test)
			{
			case nodetest_name:
				if (type == node_element && n->name && strequal(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_node:
				ns.push_back(xml_node(n), alloc);
				return true;

			case nodetest_type_comment:
				if (type == node_comment)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_text:
				if (type == node_pcdata || type == node_cdata)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_pi:
				if (type == node_pi)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_pi:
				if (type == node_pi && n->name && strequal(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_all:
				if (type == node_element)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_all_in_namespace:
				if (type == node_element && n->name && starts_with(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			default:
				assert(false && "Unknown axis"); // unreachable
			}

			return false;
		}